

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O1

object_ptr __thiscall
mjs::native_error_exception::make_error_object
          (native_error_exception *this,gc_heap_ptr<mjs::global_object> *global)

{
  gc_heap *h;
  void *pvVar1;
  long *plVar2;
  char *pcVar3;
  long *plVar4;
  gc_heap_ptr_untyped *in_RDX;
  undefined8 extraout_RDX;
  object_ptr oVar5;
  gc_heap_ptr<mjs::error_object> eo;
  gc_heap_ptr_untyped local_98;
  gc_heap_ptr_untyped local_88;
  gc_heap_ptr_untyped local_78;
  undefined1 local_68 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_60;
  wstring_view local_40;
  
  pvVar1 = gc_heap_ptr_untyped::get(in_RDX);
  h = *(gc_heap **)((long)pvVar1 + 8);
  plVar2 = (long *)gc_heap_ptr_untyped::get(in_RDX);
  pcVar3 = type_string(*(native_error_type *)&global[1].super_gc_heap_ptr_untyped.heap_);
  (**(code **)(*plVar2 + 0x98))(local_68,plVar2,pcVar3);
  plVar2 = (long *)gc_heap_ptr_untyped::get(in_RDX);
  (**(code **)(*plVar2 + 0x80))
            (&local_88,plVar2,
             *(undefined4 *)
              &(((string *)(global + 1))->super_gc_heap_ptr<mjs::gc_string>).
               super_gc_heap_ptr_untyped.heap_);
  local_40._M_str = *(wchar_t **)&global[3].super_gc_heap_ptr_untyped.pos_;
  local_40._M_len = (size_t)global[4].super_gc_heap_ptr_untyped.heap_;
  string::string((string *)&local_98,h,&local_40);
  gc_heap::
  allocate_and_construct<mjs::error_object,mjs::native_error_type_const&,mjs::string,mjs::gc_heap_ptr<mjs::object>,mjs::string>
            ((gc_heap *)&local_78,(size_t)h,(native_error_type *)0x38,(string *)(global + 1),
             (gc_heap_ptr<mjs::object> *)local_68,(string *)&local_88);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
  plVar2 = (long *)gc_heap_ptr_untyped::get(&local_78);
  plVar4 = (long *)gc_heap_ptr_untyped::get(in_RDX);
  (**(code **)(*plVar4 + 0x98))(&local_88,plVar4,"message");
  local_40._M_str = *(wchar_t **)&global[1].super_gc_heap_ptr_untyped.pos_;
  local_40._M_len = (size_t)global[2].super_gc_heap_ptr_untyped.heap_;
  string::string((string *)&local_98,h,&local_40);
  local_68._0_4_ = string;
  local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = local_98.heap_;
  local_60.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_98.pos_;
  if (local_98.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_98.heap_,(gc_heap_ptr_untyped *)(local_68 + 8));
  }
  (**(code **)(*plVar2 + 8))(plVar2,&local_88,local_68,6);
  value::destroy((value *)local_68);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_98);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_88);
  *(gc_heap **)&this->super_eval_exception = local_78.heap_;
  *(uint32_t *)&(this->super_eval_exception).field_0x8 = local_78.pos_;
  if (local_78.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_78.heap_,(gc_heap_ptr_untyped *)this);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
  oVar5.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar5.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar5.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr native_error_exception::make_error_object(const gc_heap_ptr<global_object>& global) const {
    auto& h = global->heap();
    auto eo = h.make<error_object>(type_, global->common_string(type_string(type_)), global->error_prototype(type_), string{h, stack_trace_});
    eo->put(global->common_string("message"), value{string{h, msg_}}, message_attributes);
    return eo;
}